

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fixExprCb(Walker *p,Expr *pExpr)

{
  byte *pbVar1;
  DbFixer *pDVar2;
  int iVar3;
  
  pDVar2 = (p->u).pFix;
  if (pDVar2->bTemp == '\0') {
    pbVar1 = (byte *)((long)&pExpr->flags + 3);
    *pbVar1 = *pbVar1 | 0x40;
  }
  iVar3 = 0;
  if (pExpr->op == 0x9d) {
    if ((pDVar2->pParse->db->init).busy != '\0') {
      pExpr->op = 'z';
      return iVar3;
    }
    sqlite3ErrorMsg(pDVar2->pParse,"%s cannot use variables",pDVar2->zType);
    iVar3 = 2;
  }
  return iVar3;
}

Assistant:

static int fixExprCb(Walker *p, Expr *pExpr){
  DbFixer *pFix = p->u.pFix;
  if( !pFix->bTemp ) ExprSetProperty(pExpr, EP_FromDDL);
  if( pExpr->op==TK_VARIABLE ){
    if( pFix->pParse->db->init.busy ){
      pExpr->op = TK_NULL;
    }else{
      sqlite3ErrorMsg(pFix->pParse, "%s cannot use variables", pFix->zType);
      return WRC_Abort;
    }
  }
  return WRC_Continue;
}